

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::HttpSocket::_OnData(HttpSocket *this)

{
  char *buf;
  HttpSocket *this_local;
  
  if (((this->_chunkedTransfer & 1U) == 0) &&
     ((this->_remaining == 0 || ((this->super_TcpSocket)._recvSize == 0)))) {
    _ParseHeader(this);
  }
  if ((this->_chunkedTransfer & 1U) == 0) {
    if ((this->_remaining != 0) && ((this->super_TcpSocket)._recvSize != 0)) {
      this->_remaining = this->_remaining - (this->super_TcpSocket)._recvSize;
      buf = (this->super_TcpSocket)._readptr;
      _OnRecvInternal(this,buf,(this->super_TcpSocket)._recvSize);
      if ((int)this->_remaining < 0) {
        this->_remaining = 0;
      }
      if (this->_remaining == 0) {
        if ((this->_mustClose & 1U) == 0) {
          _DequeueMore(this);
        }
        else {
          TcpSocket::close(&this->super_TcpSocket,(int)buf);
        }
      }
    }
  }
  else {
    _ProcessChunk(this);
  }
  return;
}

Assistant:

void HttpSocket::_OnData(void)
{
    if(!(_chunkedTransfer || (_remaining && _recvSize)))
        _ParseHeader();

    if(_chunkedTransfer)
    {
        _ProcessChunk(); // first, try to finish one or more chunks
    }
    else if(_remaining && _recvSize) // something remaining? if so, we got a header earlier, but not all data
    {
        _remaining -= _recvSize;
        _OnRecvInternal(_readptr, _recvSize);

        if(int(_remaining) < 0)
        {
            traceprint("_OnRecv: _remaining wrap-around, huh??\n");
            _remaining = 0;
        }
        if(!_remaining) // received last block?
        {
            if(_mustClose)
                close();
            else
                _DequeueMore();
        }

        // nothing else to do here.
    }

    // otherwise, the server sent just the header, with the data following in the next packet
}